

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O1

int ecjpake_kkp_write(mbedtls_md_type_t md_type,mbedtls_ecp_group *grp,int pf,mbedtls_ecp_point *G,
                     mbedtls_mpi *x,mbedtls_ecp_point *X,char *id,uchar **p,uchar *end,
                     _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  int iVar1;
  size_t local_40;
  size_t len;
  
  iVar1 = -0x4f00;
  if (*p <= end) {
    len._4_4_ = md_type;
    iVar1 = mbedtls_ecp_gen_keypair_base(grp,G,x,X,f_rng,p_rng);
    if (iVar1 == 0) {
      iVar1 = mbedtls_ecp_tls_write_point(grp,X,pf,&local_40,*p,(long)end - (long)*p);
      if (iVar1 == 0) {
        *p = *p + local_40;
        iVar1 = ecjpake_zkp_write(len._4_4_,grp,pf,G,x,X,id,p,end,f_rng,p_rng);
      }
    }
  }
  return iVar1;
}

Assistant:

static int ecjpake_kkp_write(const mbedtls_md_type_t md_type,
                             const mbedtls_ecp_group *grp,
                             const int pf,
                             const mbedtls_ecp_point *G,
                             mbedtls_mpi *x,
                             mbedtls_ecp_point *X,
                             const char *id,
                             unsigned char **p,
                             const unsigned char *end,
                             int (*f_rng)(void *, unsigned char *, size_t),
                             void *p_rng)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t len;

    if (end < *p) {
        return MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL;
    }

    /* Generate key (7.4.2.3.1) and write it out */
    MBEDTLS_MPI_CHK(mbedtls_ecp_gen_keypair_base((mbedtls_ecp_group *) grp, G, x, X,
                                                 f_rng, p_rng));
    MBEDTLS_MPI_CHK(mbedtls_ecp_tls_write_point(grp, X,
                                                pf, &len, *p, end - *p));
    *p += len;

    /* Generate and write proof */
    MBEDTLS_MPI_CHK(ecjpake_zkp_write(md_type, grp, pf, G, x, X, id,
                                      p, end, f_rng, p_rng));

cleanup:
    return ret;
}